

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

NodePtr HighsHashTree<int,_HighsImplications::VarBound>::removeChildFromBranchNode
                  (BranchNode *branch,int location,uint64_t hash,int hashPos)

{
  NodePtr *pNVar1;
  int iVar2;
  InnerLeaf<1> *leaf;
  void *__dest;
  InnerLeaf<3> *leaf_00;
  InnerLeaf<4> *leaf_01;
  InnerLeaf<2> *leaf_02;
  int iVar3;
  NodePtr *pNVar4;
  size_t __n;
  ulong uVar5;
  long lVar6;
  int i;
  long lVar7;
  bool bVar8;
  
  uVar5 = POPCOUNT((branch->occupation).occupation);
  if (9 < uVar5) {
LAB_002b43e2:
    iVar3 = (int)uVar5;
    uVar5 = (ulong)(iVar3 * 8 + 0x47U & 0xffffffc0);
    __n = (long)(iVar3 - location) << 3;
    if (uVar5 == (iVar3 * 8 + 0x4fU & 0xffffffc0)) {
      memmove(branch->child + location,branch[1].child + (long)location + -1,__n);
      uVar5 = (ulong)branch | 6;
    }
    else {
      __dest = operator_new(uVar5);
      uVar5 = (ulong)__dest | 6;
      lVar7 = (long)location;
      memcpy(__dest,branch,lVar7 * 8 + 8);
      memcpy((void *)(lVar7 * 8 + 8 + (long)__dest),branch[1].child + lVar7 + -1,__n);
LAB_002b446e:
      operator_delete(branch);
    }
    return (NodePtr)uVar5;
  }
  pNVar1 = branch->child;
  lVar7 = uVar5 + 1;
  lVar6 = uVar5 + 2;
  iVar3 = 0;
  pNVar4 = pNVar1;
LAB_002b432f:
  lVar6 = lVar6 + -1;
  if (lVar6 != 0) goto code_r0x002b4334;
  if (iVar3 < 0x36) {
    iVar3 = 0;
    lVar6 = lVar7;
    pNVar4 = pNVar1;
    while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
      iVar2 = NodePtr::numEntries(pNVar4);
      iVar3 = iVar3 + iVar2;
      pNVar4 = pNVar4 + 1;
    }
    if (0x35 < iVar3) goto LAB_002b43e2;
    switch(iVar3 + 9U >> 4) {
    case 0:
      leaf = (InnerLeaf<1> *)operator_new(0xd8);
      (leaf->occupation).occupation = 0;
      leaf->size = 0;
      (leaf->hashes)._M_elems[0] = 0;
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        mergeIntoLeaf<1>(leaf,hashPos,(NodePtr)pNVar1[lVar6].ptrAndType);
      }
      uVar5 = (ulong)leaf | 2;
      break;
    case 1:
      leaf_02 = (InnerLeaf<2> *)operator_new(0x2d8);
      (leaf_02->occupation).occupation = 0;
      leaf_02->size = 0;
      (leaf_02->hashes)._M_elems[0] = 0;
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        mergeIntoLeaf<2>(leaf_02,hashPos,(NodePtr)pNVar1[lVar6].ptrAndType);
      }
      uVar5 = (ulong)leaf_02 | 3;
      break;
    case 2:
      leaf_00 = (InnerLeaf<3> *)operator_new(0x4d8);
      (leaf_00->occupation).occupation = 0;
      leaf_00->size = 0;
      (leaf_00->hashes)._M_elems[0] = 0;
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        mergeIntoLeaf<3>(leaf_00,hashPos,(NodePtr)pNVar1[lVar6].ptrAndType);
      }
      uVar5 = (ulong)leaf_00 | 4;
      break;
    case 3:
      leaf_01 = (InnerLeaf<4> *)operator_new(0x6d8);
      (leaf_01->occupation).occupation = 0;
      leaf_01->size = 0;
      (leaf_01->hashes)._M_elems[0] = 0;
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        mergeIntoLeaf<4>(leaf_01,hashPos,(NodePtr)pNVar1[lVar6].ptrAndType);
      }
      uVar5 = (ulong)leaf_01 | 5;
      break;
    default:
      uVar5 = 0;
    }
    goto LAB_002b446e;
  }
  goto LAB_002b43e2;
code_r0x002b4334:
  iVar2 = NodePtr::numEntriesEstimate(pNVar4);
  iVar3 = iVar3 + iVar2;
  pNVar4 = pNVar4 + 1;
  if (0x36 < iVar3) goto LAB_002b43e2;
  goto LAB_002b432f;
}

Assistant:

static NodePtr removeChildFromBranchNode(BranchNode* branch, int location,
                                           uint64_t hash, int hashPos) {
    NodePtr newNode;
    int newNumChild = branch->occupation.num_set();

    // first check if we might be able to merge all children into one new leaf
    // based on the node numbers and assuming all of them might be in the
    // smallest size class
    if (newNumChild * InnerLeaf<1>::capacity() <= kLeafBurstThreshold) {
      // since we have a good chance of merging we now check the actual size
      // classes to see if that yields a number of entries at most the burst
      // threshold
      int childEntries = 0;
      for (int i = 0; i <= newNumChild; ++i) {
        childEntries += branch->child[i].numEntriesEstimate();
        if (childEntries > kLeafBurstThreshold) break;
      }

      if (childEntries < kLeafBurstThreshold) {
        // create a new merged inner leaf node containing all entries of
        // children first recompute the number of entries, but this time access
        // each child to get the actual number of entries needed and determine
        // this nodes size class since before we estimated the number of child
        // entries from the capacities of our child leaf node types which are
        // stored in the branch nodes pointers directly and avoid unnecessary
        // accesses of nodes that are not in cache.
        childEntries = 0;
        for (int i = 0; i <= newNumChild; ++i)
          childEntries += branch->child[i].numEntries();

        // check again if we exceed due to the extremely unlikely case
        // of having less than 5 list nodes with together more than 30 entries
        // as list nodes are only created in the last depth level
        if (childEntries < kLeafBurstThreshold) {
          switch (entries_to_size_class(childEntries)) {
            case 1: {
              InnerLeaf<1>* newLeafSize1 = new InnerLeaf<1>;
              newNode = newLeafSize1;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize1, hashPos, branch->child[i]);
              break;
            }
            case 2: {
              InnerLeaf<2>* newLeafSize2 = new InnerLeaf<2>;
              newNode = newLeafSize2;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize2, hashPos, branch->child[i]);
              break;
            }
            case 3: {
              InnerLeaf<3>* newLeafSize3 = new InnerLeaf<3>;
              newNode = newLeafSize3;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize3, hashPos, branch->child[i]);
              break;
            }
            case 4: {
              InnerLeaf<4>* newLeafSize4 = new InnerLeaf<4>;
              newNode = newLeafSize4;
              for (int i = 0; i <= newNumChild; ++i)
                mergeIntoLeaf(newLeafSize4, hashPos, branch->child[i]);
              break;
            }
            default:
              // Unexpected result from 'entries_to_size_class'
              assert(false);
          }

          destroyBranchingNode(branch);
          return newNode;
        }
      }
    }

    size_t newSize = getBranchNodeSize(newNumChild);
    size_t rightSize = (newNumChild - location) * sizeof(NodePtr);
    if (newSize == getBranchNodeSize(newNumChild + 1)) {
      // allocated size class is the same, so we do not allocate a new node
      memmove(&branch->child[location], &branch->child[location + 1],
              rightSize);
      newNode = branch;
    } else {
      // allocated size class changed, so we allocate a smaller branch node
      BranchNode* compressedBranch = (BranchNode*)::operator new(newSize);
      newNode = compressedBranch;

      size_t leftSize =
          offsetof(BranchNode, child) + location * sizeof(NodePtr);
      memcpy(compressedBranch, branch, leftSize);
      memcpy(&compressedBranch->child[location], &branch->child[location + 1],
             rightSize);

      destroyBranchingNode(branch);
    }

    return newNode;
  }